

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::computeFrhs1
          (SPxSolverBase<double> *this,VectorBase<double> *ufb,VectorBase<double> *lfb)

{
  double dVar1;
  Status SVar2;
  SVSetBase<double> *pSVar3;
  ostream *poVar4;
  SPxInternalCodeException *this_00;
  VectorBase<double> *pVVar5;
  long lVar6;
  allocator local_51;
  string local_50;
  
  lVar6 = 0;
  do {
    pSVar3 = this->thevectors;
    if ((pSVar3->set).thenum <= lVar6) {
      return;
    }
    SVar2 = ((this->super_SPxBasisBase<double>).thedesc.stat)->data[lVar6];
    if (this->theRep * SVar2 < 1) {
      pVVar5 = ufb;
      switch(SVar2) {
      case P_FIXED:
      case P_ON_LOWER:
      case D_ON_LOWER:
      case D_ON_BOTH:
        pVVar5 = lfb;
      case P_ON_UPPER:
      case D_ON_UPPER:
        dVar1 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          local_50._M_dataplus._M_p = (pointer)((ulong)dVar1 ^ 0x8000000000000000);
          VectorBase<double>::multAdd<double,double>
                    (this->theFrhs,(double *)&local_50,
                     (SVectorBase<double> *)
                     ((pSVar3->set).theitem + (pSVar3->set).thekey[lVar6].idx));
        }
        break;
      default:
        poVar4 = std::operator<<((ostream *)&std::cerr,"ESVECS03 ERROR: ");
        poVar4 = std::operator<<(poVar4,"inconsistent basis must not happen!");
        std::endl<char,std::char_traits<char>>(poVar4);
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_50,"XSVECS04 This should never happen.",&local_51);
        SPxInternalCodeException::SPxInternalCodeException(this_00,&local_50);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_FREE:
      case D_FREE:
      case D_UNDEFINED:
        break;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}